

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::operator=(Mat *this,Mat *rhs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  uint uVar5;
  int *in_RDX;
  double *extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Mat MVar9;
  
  operator_delete(rhs->v_,8);
  iVar1 = *in_RDX;
  rhs->n_rows_ = iVar1;
  iVar2 = in_RDX[1];
  rhs->n_cols_ = iVar2;
  uVar5 = iVar2 * iVar1;
  uVar8 = 0;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)uVar5) {
    uVar6 = (long)(int)uVar5 * 8;
  }
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar8;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  rhs->v_ = pdVar4;
  lVar3 = *(long *)(in_RDX + 2);
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pdVar4[uVar8] = *(double *)(lVar3 + uVar8 * 8);
  }
  Mat(this,rhs);
  MVar9.v_ = extraout_RDX;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Mat Mat::operator=(const Mat& rhs)
{
	delete v_;	
	n_rows_ = rhs.n_rows_;
	n_cols_=rhs.n_cols_;
	int nEl = n_rows_*n_cols_;
	v_ = new double [nEl];
	for (int i=0; i<nEl; i++)
		v_[i]=rhs.v_[i];
	return *this;
}